

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

uint32_t read_uint32(dwarf_buf *buf)

{
  byte *pbVar1;
  int iVar2;
  uchar *p;
  dwarf_buf *buf_local;
  
  pbVar1 = buf->buf;
  iVar2 = advance(buf,4);
  if (iVar2 == 0) {
    buf_local._4_4_ = 0;
  }
  else if (buf->is_bigendian == 0) {
    buf_local._4_4_ =
         (uint)pbVar1[3] << 0x18 | (uint)pbVar1[2] << 0x10 | (uint)pbVar1[1] << 8 | (uint)*pbVar1;
  }
  else {
    buf_local._4_4_ =
         (uint)*pbVar1 << 0x18 | (uint)pbVar1[1] << 0x10 | (uint)pbVar1[2] << 8 | (uint)pbVar1[3];
  }
  return buf_local._4_4_;
}

Assistant:

static uint32_t
read_uint32 (struct dwarf_buf *buf)
{
  const unsigned char *p = buf->buf;

  if (!advance (buf, 4))
    return 0;
  if (buf->is_bigendian)
    return (((uint32_t) p[0] << 24) | ((uint32_t) p[1] << 16)
	    | ((uint32_t) p[2] << 8) | (uint32_t) p[3]);
  else
    return (((uint32_t) p[3] << 24) | ((uint32_t) p[2] << 16)
	    | ((uint32_t) p[1] << 8) | (uint32_t) p[0]);
}